

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus ParseVP8XChunks(WebPDemuxer *dmux)

{
  size_t sVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  MemBuffer *pMVar6;
  size_t sVar7;
  MemBuffer *in_RDI;
  uint32_t chunk_size_padded;
  uint32_t chunk_size;
  uint32_t fourcc;
  size_t chunk_start_offset;
  int store_chunk;
  ParseStatus status;
  int anim_chunks;
  MemBuffer *mem;
  int is_animation;
  uint32_t in_stack_ffffffffffffffac;
  MemBuffer *in_stack_ffffffffffffffb0;
  WebPDemuxer *dmux_00;
  uint frame_chunk_size;
  ParseStatus PVar8;
  int iVar9;
  
  sVar1 = in_RDI[1].end;
  iVar9 = 0;
  PVar8 = PARSE_OK;
  do {
    frame_chunk_size = 1;
    dmux_00 = (WebPDemuxer *)in_RDI->start;
    uVar2 = ReadLE32(in_stack_ffffffffffffffb0);
    uVar3 = ReadLE32(in_stack_ffffffffffffffb0);
    if (0xfffffff6 < uVar3) {
      return PARSE_ERROR;
    }
    uVar4 = uVar3 + (uVar3 & 1);
    iVar5 = SizeIsInvalid(in_RDI,(ulong)uVar4);
    if (iVar5 != 0) {
      return PARSE_ERROR;
    }
    if (uVar2 == 0x20385056) {
LAB_0010a267:
      if ((0 < iVar9) || ((sVar1 & 2) != 0)) {
        return PARSE_ERROR;
      }
      Rewind(in_RDI,8);
      PVar8 = ParseSingleImage(dmux_00);
      goto LAB_0010a42f;
    }
    if (uVar2 == 0x20504d58) {
      frame_chunk_size = (uint)((in_RDI[1].end & 4) != 0);
LAB_0010a3c5:
      in_stack_ffffffffffffffb0 = (MemBuffer *)(ulong)uVar4;
      pMVar6 = (MemBuffer *)MemDataSize(in_RDI);
      if (pMVar6 < in_stack_ffffffffffffffb0) {
        PVar8 = PARSE_NEED_MORE_DATA;
      }
      else {
        if ((frame_chunk_size != 0) &&
           (iVar5 = StoreChunk((WebPDemuxer *)CONCAT44(uVar4,uVar2),
                               (size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac),
           iVar5 == 0)) {
          return PARSE_ERROR;
        }
        Skip(in_RDI,(ulong)uVar4);
      }
    }
    else {
      if (uVar2 == 0x46495845) {
        frame_chunk_size = (uint)((in_RDI[1].end & 8) != 0);
        goto LAB_0010a3c5;
      }
      if (uVar2 == 0x464d4e41) {
        if (iVar9 == 0) {
          return PARSE_ERROR;
        }
        PVar8 = ParseAnimationFrame((WebPDemuxer *)CONCAT44(iVar9,PVar8),frame_chunk_size);
        goto LAB_0010a42f;
      }
      if ((uVar2 == 0x48504c41) || (uVar2 == 0x4c385056)) goto LAB_0010a267;
      if (uVar2 != 0x4d494e41) {
        if (uVar2 == 0x50434349) {
          frame_chunk_size = (uint)((in_RDI[1].end & 0x20) != 0);
        }
        else if (uVar2 == 0x58385056) {
          return PARSE_ERROR;
        }
        goto LAB_0010a3c5;
      }
      if (uVar4 < 6) {
        return PARSE_ERROR;
      }
      sVar7 = MemDataSize(in_RDI);
      if (sVar7 < uVar4) {
        PVar8 = PARSE_NEED_MORE_DATA;
      }
      else {
        if (iVar9 != 0) {
          frame_chunk_size = 0;
          goto LAB_0010a3c5;
        }
        iVar9 = 1;
        uVar2 = ReadLE32(in_stack_ffffffffffffffb0);
        *(uint32_t *)&in_RDI[1].buf_size = uVar2;
        iVar5 = ReadLE16s(in_stack_ffffffffffffffb0);
        *(int *)((long)&in_RDI[1].riff_end + 4) = iVar5;
        Skip(in_RDI,(ulong)(uVar4 - 6));
      }
    }
LAB_0010a42f:
    if (in_RDI->start == in_RDI->riff_end) {
      return PVar8;
    }
    sVar7 = MemDataSize(in_RDI);
    if (sVar7 < 8) {
      PVar8 = PARSE_NEED_MORE_DATA;
    }
    if (PVar8 != PARSE_OK) {
      return PVar8;
    }
  } while( true );
}

Assistant:

static ParseStatus ParseVP8XChunks(WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags & ANIMATION_FLAG);
  MemBuffer* const mem = &dmux->mem;
  int anim_chunks = 0;
  ParseStatus status = PARSE_OK;

  do {
    int store_chunk = 1;
    const size_t chunk_start_offset = mem->start;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t chunk_size = ReadLE32(mem);
    uint32_t chunk_size_padded;

    if (chunk_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    chunk_size_padded = chunk_size + (chunk_size & 1);
    if (SizeIsInvalid(mem, chunk_size_padded)) return PARSE_ERROR;

    switch (fourcc) {
      case MKFOURCC('V', 'P', '8', 'X'): {
        return PARSE_ERROR;
      }
      case MKFOURCC('A', 'L', 'P', 'H'):
      case MKFOURCC('V', 'P', '8', ' '):
      case MKFOURCC('V', 'P', '8', 'L'): {
        // check that this isn't an animation (all frames should be in an ANMF).
        if (anim_chunks > 0 || is_animation) return PARSE_ERROR;

        Rewind(mem, CHUNK_HEADER_SIZE);
        status = ParseSingleImage(dmux);
        break;
      }
      case MKFOURCC('A', 'N', 'I', 'M'): {
        if (chunk_size_padded < ANIM_CHUNK_SIZE) return PARSE_ERROR;

        if (MemDataSize(mem) < chunk_size_padded) {
          status = PARSE_NEED_MORE_DATA;
        } else if (anim_chunks == 0) {
          ++anim_chunks;
          dmux->bgcolor = ReadLE32(mem);
          dmux->loop_count = ReadLE16s(mem);
          Skip(mem, chunk_size_padded - ANIM_CHUNK_SIZE);
        } else {
          store_chunk = 0;
          goto Skip;
        }
        break;
      }
      case MKFOURCC('A', 'N', 'M', 'F'): {
        if (anim_chunks == 0) return PARSE_ERROR;  // 'ANIM' precedes frames.
        status = ParseAnimationFrame(dmux, chunk_size_padded);
        break;
      }
      case MKFOURCC('I', 'C', 'C', 'P'): {
        store_chunk = !!(dmux->feature_flags & ICCP_FLAG);
        goto Skip;
      }
      case MKFOURCC('E', 'X', 'I', 'F'): {
        store_chunk = !!(dmux->feature_flags & EXIF_FLAG);
        goto Skip;
      }
      case MKFOURCC('X', 'M', 'P', ' '): {
        store_chunk = !!(dmux->feature_flags & XMP_FLAG);
        goto Skip;
      }
 Skip:
      default: {
        if (chunk_size_padded <= MemDataSize(mem)) {
          if (store_chunk) {
            // Store only the chunk header and unpadded size as only the payload
            // will be returned to the user.
            if (!StoreChunk(dmux, chunk_start_offset,
                            CHUNK_HEADER_SIZE + chunk_size)) {
              return PARSE_ERROR;
            }
          }
          Skip(mem, chunk_size_padded);
        } else {
          status = PARSE_NEED_MORE_DATA;
        }
      }
    }

    if (mem->start == mem->riff_end) {
      break;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (status == PARSE_OK);

  return status;
}